

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.h
# Opt level: O2

Analysis __thiscall spvtools::opt::CCPPass::GetPreservedAnalyses(CCPPass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisDominatorAnalysis|kAnalysisCFG|
         kAnalysisCombinators|kAnalysisDecorations|kAnalysisInstrToBlockMapping|kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisConstants |
           IRContext::kAnalysisTypes;
  }